

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O3

int mbedtls_cipher_write_tag(mbedtls_cipher_context_t *ctx,uchar *tag,size_t tag_len)

{
  int iVar1;
  
  iVar1 = -0x6100;
  if ((((ctx != (mbedtls_cipher_context_t *)0x0) &&
       (tag != (uchar *)0x0 && ctx->cipher_info != (mbedtls_cipher_info_t *)0x0)) &&
      (ctx->operation == MBEDTLS_ENCRYPT)) &&
     (iVar1 = 0, ctx->cipher_info->mode == MBEDTLS_MODE_GCM)) {
    iVar1 = mbedtls_gcm_finish((mbedtls_gcm_context *)ctx->cipher_ctx,tag,tag_len);
    return iVar1;
  }
  return iVar1;
}

Assistant:

int mbedtls_cipher_write_tag( mbedtls_cipher_context_t *ctx,
                      unsigned char *tag, size_t tag_len )
{
    if( NULL == ctx || NULL == ctx->cipher_info || NULL == tag )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

    if( MBEDTLS_ENCRYPT != ctx->operation )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

    if( MBEDTLS_MODE_GCM == ctx->cipher_info->mode )
        return mbedtls_gcm_finish( (mbedtls_gcm_context *) ctx->cipher_ctx, tag, tag_len );

    return( 0 );
}